

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EstimatorUtilStats.h
# Opt level: O0

void WriteRawData(FILE *f,vector<Estimates,_std::allocator<Estimates>_> *estimates)

{
  bool bVar1;
  reference pEVar2;
  Estimates *est;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Estimates,_std::allocator<Estimates>_> *__range1;
  vector<Estimates,_std::allocator<Estimates>_> *estimates_local;
  FILE *f_local;
  
  fprintf((FILE *)f,"triangle_estimate,fraction_of_edges_seen,fraction_of_vertices_seen\n");
  __end1 = std::vector<Estimates,_std::allocator<Estimates>_>::begin(estimates);
  est = (Estimates *)std::vector<Estimates,_std::allocator<Estimates>_>::end(estimates);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Estimates_*,_std::vector<Estimates,_std::allocator<Estimates>_>_>
                                *)&est);
    if (!bVar1) break;
    pEVar2 = __gnu_cxx::
             __normal_iterator<const_Estimates_*,_std::vector<Estimates,_std::allocator<Estimates>_>_>
             ::operator*(&__end1);
    fprintf((FILE *)f,"%.3lf,%.6lf,%.6lf\n",pEVar2->estimate,pEVar2->fraction_of_edges_seen,
            pEVar2->fraction_of_vertices_seen);
    __gnu_cxx::
    __normal_iterator<const_Estimates_*,_std::vector<Estimates,_std::allocator<Estimates>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void WriteRawData (FILE *f, std::vector<Estimates> const &estimates) {
    fprintf(f, "triangle_estimate,fraction_of_edges_seen,fraction_of_vertices_seen\n");
    for (auto & est : estimates) {
        fprintf(f, "%.3lf,%.6lf,%.6lf\n", est.estimate, est.fraction_of_edges_seen,
                est.fraction_of_vertices_seen);
    }
}